

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O0

void __thiscall
ExportEmitString_EscapeQuotes_Test::TestBody(ExportEmitString_EscapeQuotes_Test *this)

{
  bool bVar1;
  const_iterator first;
  const_iterator last;
  string *lhs;
  char *message;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  char *expected;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  ostringstream os;
  ExportEmitString_EscapeQuotes_Test *this_local;
  
  pstore::exchange::export_ns::ostringstream::ostringstream
            ((ostringstream *)((long)&str.field_2 + 8));
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               "a \" b",5);
  first = std::begin<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  last = std::end<std::__cxx11::string>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  pstore::exchange::export_ns::
  emit_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((ostream_base *)((long)&str.field_2 + 8),
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )first._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )last._M_current);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )anon_var_dwarf_db6ea;
  lhs = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                  ((ostringstream *)((long)&str.field_2 + 8));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
            ((EqHelper *)local_b8,"os.str ()","expected",lhs,(char **)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_emit.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::__cxx11::string::~string((string *)local_80);
  pstore::exchange::export_ns::ostringstream::~ostringstream
            ((ostringstream *)((long)&str.field_2 + 8));
  return;
}

Assistant:

TEST (ExportEmitString, EscapeQuotes) {
    using namespace std::string_literals;

    pstore::exchange::export_ns::ostringstream os;
    auto const str = R"(a " b)"s;
    pstore::exchange::export_ns::emit_string (os, std::begin (str), std::end (str));
    constexpr auto * expected = R"("a \" b")";
    EXPECT_EQ (os.str (), expected);
}